

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

BytePtr stackjit::Runtime::getVirtualFunctionAddress(RawClassRef rawClassRef,int index)

{
  VMState *pVVar1;
  GarbageCollector *this;
  ClassMetadata *pCVar2;
  BytePtr *ppuVar3;
  string *psVar4;
  ExecutionEngine *this_00;
  runtime_error *e;
  JitFunction local_90;
  JitFunction entryPoint;
  string signature;
  BytePtr funcPtr;
  ClassType *local_48;
  ClassType *classType;
  ClassRef classRef;
  int index_local;
  RawClassRef rawClassRef_local;
  
  classRef.mMetadata._4_4_ = index;
  pVVar1 = vmState();
  this = VMState::gc(pVVar1);
  GarbageCollector::getClassRef((ClassRef *)&classType,this,rawClassRef);
  ClassRef::objRef((ObjectRef *)&funcPtr,(ClassRef *)&classType);
  local_48 = (ClassType *)ObjectRef::type((ObjectRef *)&funcPtr);
  pCVar2 = ClassType::metadata(local_48);
  ppuVar3 = ClassMetadata::virtualFunctionTable(pCVar2);
  rawClassRef_local = ppuVar3[classRef.mMetadata._4_4_];
  if (rawClassRef_local == (BytePtr)0x0) {
    pCVar2 = ClassType::metadata(local_48);
    psVar4 = ClassMetadata::getVirtualFunctionSignature_abi_cxx11_(pCVar2,classRef.mMetadata._4_4_);
    std::__cxx11::string::string((string *)&entryPoint,(string *)psVar4);
    local_90 = (JitFunction)0x0;
    pVVar1 = vmState();
    this_00 = VMState::engine(pVVar1);
    ExecutionEngine::compileFunction(this_00,(string *)&entryPoint,&local_90);
    rawClassRef_local = (RawClassRef)local_90;
    std::__cxx11::string::~string((string *)&entryPoint);
  }
  return rawClassRef_local;
}

Assistant:

BytePtr Runtime::getVirtualFunctionAddress(RawClassRef rawClassRef, int index) {
		auto classRef = vmState()->gc().getClassRef(rawClassRef);
		auto classType = static_cast<const ClassType*>(classRef.objRef().type());
		auto funcPtr = classType->metadata()->virtualFunctionTable()[index];

		if (funcPtr != nullptr) {
			return funcPtr;
		} else {
			//Compile
			auto signature = classType->metadata()->getVirtualFunctionSignature(index);
			JitFunction entryPoint = nullptr;
			try {
				vmState()->engine().compileFunction(signature, entryPoint);
			} catch (std::runtime_error& e) {
				std::cout << e.what() << std::endl;
				exit(0);
			}

			return (BytePtr)entryPoint;
		}
	}